

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall HighsSymmetryDetection::determineNextToDistinguish(HighsSymmetryDetection *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  reference piVar4;
  reference ppiVar5;
  reference ppiVar6;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  long in_RDI;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> nextDistinguishPos_2;
  iterator i_1;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> nextDistinguishPos_1;
  iterator i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> nextDistinguishPos;
  iterator cellEnd;
  iterator cellStart;
  Node *currNode;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
  *in_stack_fffffffffffffef0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff08;
  vector<int_*,_std::allocator<int_*>_> *in_stack_ffffffffffffff10;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> in_stack_ffffffffffffff28;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_b8;
  reference local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_a0 [2];
  int **local_90;
  int **local_88;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_80;
  reference local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  reference local_68;
  int *local_60;
  int *local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  int *local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  reference local_18;
  
  local_18 = std::
             vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
             back(in_stack_fffffffffffffef0);
  std::vector<int_*,_std::allocator<int_*>_>::clear
            ((vector<int_*,_std::allocator<int_*>_> *)0x6c7f71);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_20);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_28);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
  local_30 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffef8,(difference_type)in_stack_fffffffffffffef0);
  local_20 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_30;
  local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)local_18->targetCell);
  local_60 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffef8,(difference_type)in_stack_fffffffffffffef0);
  local_40 = local_60;
  local_28 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_60;
  if (local_18->lastDistiguished == -1) {
    local_58 = local_20._M_current;
    __last._M_current._4_4_ = in_stack_ffffffffffffff04;
    __last._M_current._0_4_ = in_stack_ffffffffffffff00;
    local_50 = std::
               min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (in_stack_ffffffffffffff08,__last);
    local_68 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_50);
    std::vector<int_*,_std::allocator<int_*>_>::push_back
              ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffef0,
               (value_type *)in_stack_fffffffffffffee8);
  }
  else {
    sVar3 = std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
            ::size((vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                    *)(in_RDI + 0x2b8));
    if (*(int *)(in_RDI + 0x298) < (int)sVar3) {
      local_70._M_current = local_20._M_current;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffef0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffee8), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_70);
        if (local_18->lastDistiguished < *piVar4) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_70);
          bVar1 = checkStoredAutomorphism
                            ((HighsSymmetryDetection *)in_stack_ffffffffffffff28._M_current,
                             (HighsInt)((ulong)in_RDI >> 0x20));
          if (bVar1) {
            in_stack_ffffffffffffff10 = (vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 0x158);
            local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_70);
            std::vector<int_*,_std::allocator<int_*>_>::push_back
                      ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffef0,
                       (value_type *)in_stack_fffffffffffffee8);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_70);
      }
      bVar1 = std::vector<int_*,_std::allocator<int_*>_>::empty
                        ((vector<int_*,_std::allocator<int_*>_> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (bVar1) {
        return false;
      }
      local_88 = (int **)std::vector<int_*,_std::allocator<int_*>_>::begin
                                   ((vector<int_*,_std::allocator<int_*>_> *)
                                    in_stack_fffffffffffffee8);
      local_90 = (int **)std::vector<int_*,_std::allocator<int_*>_>::end
                                   ((vector<int_*,_std::allocator<int_*>_> *)
                                    in_stack_fffffffffffffee8);
      local_80 = std::
                 min_element<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,HighsSymmetryDetection::determineNextToDistinguish()::__0>
                           (local_88,local_90);
      local_a0[0]._M_current =
           (int **)std::vector<int_*,_std::allocator<int_*>_>::begin
                             ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffee8);
      ppiVar5 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*(local_a0);
      ppiVar6 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*(&local_80);
      std::swap<int*>(ppiVar5,ppiVar6);
      std::vector<int_*,_std::allocator<int_*>_>::resize
                (in_stack_ffffffffffffff10,(size_type)ppiVar5);
    }
    else {
      local_a8._M_current = local_20._M_current;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffef0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffee8), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_a8);
        if (local_18->lastDistiguished < *piVar4) {
          this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 200);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_a8);
          HVar2 = getOrbit((HighsSymmetryDetection *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (HighsInt)((ulong)this_00 >> 0x20));
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)HVar2);
          in_stack_ffffffffffffff04 = *pvVar7;
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          if (in_stack_ffffffffffffff04 == *piVar4) {
            in_stack_fffffffffffffef0 =
                 (vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                  *)(in_RDI + 0x158);
            local_b0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_a8);
            std::vector<int_*,_std::allocator<int_*>_>::push_back
                      ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffef0,
                       (value_type *)in_stack_fffffffffffffee8);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_a8);
      }
      bVar1 = std::vector<int_*,_std::allocator<int_*>_>::empty
                        ((vector<int_*,_std::allocator<int_*>_> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (bVar1) {
        return false;
      }
      iVar8 = std::vector<int_*,_std::allocator<int_*>_>::begin
                        ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffee8);
      iVar9 = std::vector<int_*,_std::allocator<int_*>_>::end
                        ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffee8);
      local_b8 = std::
                 min_element<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,HighsSymmetryDetection::determineNextToDistinguish()::__1>
                           (iVar8._M_current,iVar9._M_current);
      std::vector<int_*,_std::allocator<int_*>_>::begin
                ((vector<int_*,_std::allocator<int_*>_> *)in_stack_fffffffffffffee8);
      ppiVar5 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*((__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> *)
                          &stack0xffffffffffffff28);
      ppiVar6 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
                operator*(&local_b8);
      std::swap<int*>(ppiVar5,ppiVar6);
      std::vector<int_*,_std::allocator<int_*>_>::resize
                (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08._M_current);
    }
  }
  return true;
}

Assistant:

bool HighsSymmetryDetection::determineNextToDistinguish() {
  Node& currNode = nodeStack.back();
  distinguishCands.clear();
  std::vector<HighsInt>::iterator cellStart;
  std::vector<HighsInt>::iterator cellEnd;
  cellStart = currentPartition.begin() + currNode.targetCell;
  cellEnd =
      currentPartition.begin() + currentPartitionLinks[currNode.targetCell];

  if (currNode.lastDistiguished == -1) {
    auto nextDistinguishPos = std::min_element(cellStart, cellEnd);
    distinguishCands.push_back(&*nextDistinguishPos);
  } else if ((HighsInt)nodeStack.size() > firstPathDepth) {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && checkStoredAutomorphism(*i))
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  } else {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && vertexGroundSet[getOrbit(*i)] == *i)
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  }

  return true;
}